

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

int decrypt_and_print(ptls_t *tls,uint8_t *input,size_t inlen)

{
  int iVar1;
  size_t local_458;
  size_t consumed;
  undefined1 local_448 [4];
  int ret;
  uint8_t decryptbuf_small [1024];
  ptls_buffer_t decryptbuf;
  size_t inlen_local;
  uint8_t *input_local;
  ptls_t *tls_local;
  
  ptls_buffer_init((ptls_buffer_t *)(decryptbuf_small + 0x3f8),local_448,0x400);
  decryptbuf._24_8_ = inlen;
  inlen_local = (size_t)input;
  while( true ) {
    if (decryptbuf._24_8_ == 0) {
      ptls_buffer_dispose((ptls_buffer_t *)(decryptbuf_small + 0x3f8));
      return 0;
    }
    local_458 = decryptbuf._24_8_;
    consumed._4_4_ =
         ptls_receive(tls,(ptls_buffer_t *)(decryptbuf_small + 0x3f8),(void *)inlen_local,&local_458
                     );
    if (consumed._4_4_ != 0) break;
    inlen_local = local_458 + inlen_local;
    decryptbuf._24_8_ = decryptbuf._24_8_ - local_458;
    if (decryptbuf.capacity != 0) {
      iVar1 = write_all(1,(uint8_t *)decryptbuf_small._1016_8_,decryptbuf.capacity);
      if (iVar1 != 0) {
        return -1;
      }
      decryptbuf.capacity = 0;
    }
  }
  fprintf(_stderr,"ptls_receive:%d\n",(ulong)consumed._4_4_);
  return -1;
}

Assistant:

static int decrypt_and_print(ptls_t *tls, const uint8_t *input, size_t inlen)
{
    ptls_buffer_t decryptbuf;
    uint8_t decryptbuf_small[1024];
    int ret;

    ptls_buffer_init(&decryptbuf, decryptbuf_small, sizeof(decryptbuf_small));

    while (inlen != 0) {
        size_t consumed = inlen;
        if ((ret = ptls_receive(tls, &decryptbuf, input, &consumed)) != 0) {
            fprintf(stderr, "ptls_receive:%d\n", ret);
            return -1;
        }
        input += consumed;
        inlen -= consumed;
        if (decryptbuf.off != 0) {
            if (write_all(1, decryptbuf.base, decryptbuf.off) != 0)
                return -1;
            decryptbuf.off = 0;
        }
    }

    ptls_buffer_dispose(&decryptbuf);
    return 0;
}